

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

Num3072 * __thiscall Num3072::GetInverse(Num3072 *__return_storage_ptr__,Num3072 *this)

{
  Num3072 *this_00;
  long lVar1;
  int j;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  Num3072 p [12];
  
  p[1].limbs[0x11] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    SetToOne((Num3072 *)((long)p[0].limbs + lVar3));
    lVar3 = lVar3 + 0x180;
  } while (lVar3 != 0x1200);
  SetToOne(__return_storage_ptr__);
  memcpy(p,this,0x180);
  lVar3 = 0;
  while (lVar3 != 0xb) {
    this_00 = p + lVar3 + 1;
    memcpy(this_00,p + lVar3,0x180);
    for (uVar2 = 0; uVar2 >> ((byte)lVar3 & 0x1f) == 0; uVar2 = uVar2 + 1) {
      Square(this_00);
    }
    Multiply(this_00,p + lVar3);
    lVar3 = lVar3 + 1;
  }
  memcpy(__return_storage_ptr__,p + 0xb,0x180);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,0x200,p + 9);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,0x100,p + 8);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,0x80,p + 7);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,0x40,p + 6);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,0x20,p + 5);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,8,p + 3);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,2,p + 1);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,1,p);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,5,p + 2);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,3,p);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,2,p);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,4,p);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,4,p + 1);
  anon_unknown.dwarf_23ed29f::square_n_mul(__return_storage_ptr__,3,p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Num3072 Num3072::GetInverse() const
{
    // For fast exponentiation a sliding window exponentiation with repunit
    // precomputation is utilized. See "Fast Point Decompression for Standard
    // Elliptic Curves" (Brumley, Järvinen, 2008).

    Num3072 p[12]; // p[i] = a^(2^(2^i)-1)
    Num3072 out;

    p[0] = *this;

    for (int i = 0; i < 11; ++i) {
        p[i + 1] = p[i];
        for (int j = 0; j < (1 << i); ++j) p[i + 1].Square();
        p[i + 1].Multiply(p[i]);
    }

    out = p[11];

    square_n_mul(out, 512, p[9]);
    square_n_mul(out, 256, p[8]);
    square_n_mul(out, 128, p[7]);
    square_n_mul(out, 64, p[6]);
    square_n_mul(out, 32, p[5]);
    square_n_mul(out, 8, p[3]);
    square_n_mul(out, 2, p[1]);
    square_n_mul(out, 1, p[0]);
    square_n_mul(out, 5, p[2]);
    square_n_mul(out, 3, p[0]);
    square_n_mul(out, 2, p[0]);
    square_n_mul(out, 4, p[0]);
    square_n_mul(out, 4, p[1]);
    square_n_mul(out, 3, p[0]);

    return out;
}